

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void gatherSelectWindows(Select *p)

{
  undefined1 local_40 [8];
  Walker w;
  Select *p_local;
  
  w.pParse = (Parse *)gatherSelectWindowsCallback;
  w.xExprCallback = gatherSelectWindowsSelectCallback;
  w.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
  local_40 = (undefined1  [8])0x0;
  w._32_8_ = p;
  w.u.pSelect = p;
  sqlite3WalkSelect((Walker *)local_40,p);
  return;
}

Assistant:

static void gatherSelectWindows(Select *p){
  Walker w;
  w.xExprCallback = gatherSelectWindowsCallback;
  w.xSelectCallback = gatherSelectWindowsSelectCallback;
  w.xSelectCallback2 = 0;
  w.pParse = 0;
  w.u.pSelect = p;
  sqlite3WalkSelect(&w, p);
}